

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void J400ToARGBRow_C(uint8_t *src_y,uint8_t *dst_argb,int width)

{
  uint8_t uVar1;
  long lVar2;
  
  if (0 < width) {
    lVar2 = 0;
    do {
      uVar1 = src_y[lVar2];
      dst_argb[lVar2 * 4] = uVar1;
      dst_argb[lVar2 * 4 + 1] = uVar1;
      dst_argb[lVar2 * 4 + 2] = uVar1;
      dst_argb[lVar2 * 4 + 3] = 0xff;
      lVar2 = lVar2 + 1;
    } while (width != (int)lVar2);
  }
  return;
}

Assistant:

void J400ToARGBRow_C(const uint8_t* src_y, uint8_t* dst_argb, int width) {
  // Copy a Y to RGB.
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t y = src_y[0];
    dst_argb[2] = dst_argb[1] = dst_argb[0] = y;
    dst_argb[3] = 255u;
    dst_argb += 4;
    ++src_y;
  }
}